

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.hpp
# Opt level: O0

SubcaseBasePtr
deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength_cs_packed_matC>
          (void)

{
  AdvancedUnsizedArrayLength_cs_packed_matC *this;
  SharedPtrStateBase *extraout_RDX;
  SharedPtr<deqp::SubcaseBase> *in_RDI;
  SubcaseBasePtr SVar1;
  
  this = (AdvancedUnsizedArrayLength_cs_packed_matC *)operator_new(0x68);
  (this->super_AdvancedUnsizedArrayLength2).stage = 0;
  (this->super_AdvancedUnsizedArrayLength2).etype = 0;
  (this->super_AdvancedUnsizedArrayLength2).layout = 0;
  (this->super_AdvancedUnsizedArrayLength2).other_members = false;
  *(undefined3 *)&(this->super_AdvancedUnsizedArrayLength2).field_0x5d = 0;
  (this->super_AdvancedUnsizedArrayLength2).m_storage_buffer[5] = 0;
  (this->super_AdvancedUnsizedArrayLength2).m_storage_buffer[6] = 0;
  *(undefined8 *)((this->super_AdvancedUnsizedArrayLength2).m_storage_buffer + 7) = 0;
  (this->super_AdvancedUnsizedArrayLength2).m_storage_buffer[1] = 0;
  (this->super_AdvancedUnsizedArrayLength2).m_storage_buffer[2] = 0;
  (this->super_AdvancedUnsizedArrayLength2).m_storage_buffer[3] = 0;
  (this->super_AdvancedUnsizedArrayLength2).m_storage_buffer[4] = 0;
  (this->super_AdvancedUnsizedArrayLength2).super_ShaderStorageBufferObjectBase.super_SubcaseBase.
  super_GLWrapper.m_context = (Context *)0x0;
  (this->super_AdvancedUnsizedArrayLength2).m_program = 0;
  (this->super_AdvancedUnsizedArrayLength2).m_storage_buffer[0] = 0;
  (this->super_AdvancedUnsizedArrayLength2).super_ShaderStorageBufferObjectBase.super_SubcaseBase.
  super_GLWrapper.super_CallLogWrapper.m_log = (TestLog *)0x0;
  *(undefined8 *)
   &(this->super_AdvancedUnsizedArrayLength2).super_ShaderStorageBufferObjectBase.super_SubcaseBase.
    super_GLWrapper.super_CallLogWrapper.m_enableLog = 0;
  (this->super_AdvancedUnsizedArrayLength2).super_ShaderStorageBufferObjectBase.super_SubcaseBase.
  super_GLWrapper._vptr_GLWrapper = (_func_int **)0x0;
  (this->super_AdvancedUnsizedArrayLength2).super_ShaderStorageBufferObjectBase.super_SubcaseBase.
  super_GLWrapper.super_CallLogWrapper.m_gl = (Functions *)0x0;
  (this->super_AdvancedUnsizedArrayLength2).bind_seq = 0;
  (this->super_AdvancedUnsizedArrayLength2).length_as_index = false;
  *(undefined3 *)&(this->super_AdvancedUnsizedArrayLength2).field_0x65 = 0;
  gl4cts::anon_unknown_0::AdvancedUnsizedArrayLength_cs_packed_matC::
  AdvancedUnsizedArrayLength_cs_packed_matC(this);
  de::SharedPtr<deqp::SubcaseBase>::SharedPtr(in_RDI,(SubcaseBase *)this);
  SVar1.m_state = extraout_RDX;
  SVar1.m_ptr = (SubcaseBase *)in_RDI;
  return SVar1;
}

Assistant:

static SubcaseBase::SubcaseBasePtr Create()
	{
		return SubcaseBase::SubcaseBasePtr(new Type());
	}